

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall testing::internal::GTestFlagSaver::~GTestFlagSaver(GTestFlagSaver *this)

{
  GTestFlagSaver *this_local;
  
  FLAGS_gtest_also_run_disabled_tests = this->also_run_disabled_tests_ & 1;
  FLAGS_gtest_break_on_failure = this->break_on_failure_ & 1;
  FLAGS_gtest_catch_exceptions = this->catch_exceptions_ & 1;
  String::operator=((String *)FLAGS_gtest_color,&this->color_);
  String::operator=((String *)FLAGS_gtest_death_test_style,&this->death_test_style_);
  FLAGS_gtest_death_test_use_fork = this->death_test_use_fork_ & 1;
  String::operator=((String *)FLAGS_gtest_filter,&this->filter_);
  String::operator=((String *)FLAGS_gtest_internal_run_death_test,&this->internal_run_death_test_);
  FLAGS_gtest_list_tests = this->list_tests_ & 1;
  String::operator=((String *)FLAGS_gtest_output,&this->output_);
  FLAGS_gtest_print_time = this->print_time_ & 1;
  FLAGS_gtest_random_seed = this->random_seed_;
  FLAGS_gtest_repeat = this->repeat_;
  FLAGS_gtest_shuffle = this->shuffle_ & 1;
  FLAGS_gtest_stack_trace_depth = this->stack_trace_depth_;
  String::operator=((String *)FLAGS_gtest_stream_result_to,&this->stream_result_to_);
  FLAGS_gtest_throw_on_failure = this->throw_on_failure_ & 1;
  String::~String(&this->stream_result_to_);
  String::~String(&this->output_);
  String::~String(&this->internal_run_death_test_);
  String::~String(&this->filter_);
  String::~String(&this->death_test_style_);
  String::~String(&this->color_);
  return;
}

Assistant:

~GTestFlagSaver() {
    GTEST_FLAG(also_run_disabled_tests) = also_run_disabled_tests_;
    GTEST_FLAG(break_on_failure) = break_on_failure_;
    GTEST_FLAG(catch_exceptions) = catch_exceptions_;
    GTEST_FLAG(color) = color_;
    GTEST_FLAG(death_test_style) = death_test_style_;
    GTEST_FLAG(death_test_use_fork) = death_test_use_fork_;
    GTEST_FLAG(filter) = filter_;
    GTEST_FLAG(internal_run_death_test) = internal_run_death_test_;
    GTEST_FLAG(list_tests) = list_tests_;
    GTEST_FLAG(output) = output_;
    GTEST_FLAG(print_time) = print_time_;
    GTEST_FLAG(random_seed) = random_seed_;
    GTEST_FLAG(repeat) = repeat_;
    GTEST_FLAG(shuffle) = shuffle_;
    GTEST_FLAG(stack_trace_depth) = stack_trace_depth_;
    GTEST_FLAG(stream_result_to) = stream_result_to_;
    GTEST_FLAG(throw_on_failure) = throw_on_failure_;
  }